

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

void scp_sink_free(ScpServer *s)

{
  ScpServerVtable *ptr;
  
  scp_reply_cleanup((ScpReplyReceiver *)(s + -0x10));
  bufchain_clear((bufchain *)(s + -0x24));
  strbuf_free((strbuf *)s[-0x1e].vt);
  strbuf_free((strbuf *)s[-0x1c].vt);
  while (ptr = s[-0x2a].vt, ptr != (ScpServerVtable *)0x0) {
    s[-0x2a].vt = (ScpServerVtable *)ptr->free;
    safefree(ptr);
  }
  safefree(s[-0x12].vt);
  delete_callbacks_for_context(s + -0x2c);
  safefree(s + -0x2c);
  return;
}

Assistant:

static void scp_sink_free(ScpServer *s)
{
    ScpSink *scp = container_of(s, ScpSink, scpserver);

    scp_reply_cleanup(&scp->reply);
    bufchain_clear(&scp->data);
    strbuf_free(scp->command);
    strbuf_free(scp->filename_sb);
    while (scp->head)
        scp_sink_pop(scp);
    sfree(scp->errmsg);

    delete_callbacks_for_context(scp);

    sfree(scp);
}